

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_edge.c
# Opt level: O0

REF_STATUS ref_edge_with(REF_EDGE ref_edge,REF_INT node0,REF_INT node1,REF_INT *edge)

{
  REF_INT local_44;
  REF_INT local_40;
  int local_3c;
  REF_INT n1;
  REF_INT n0;
  REF_INT ref;
  REF_INT item;
  REF_INT *edge_local;
  REF_INT node1_local;
  REF_INT node0_local;
  REF_EDGE ref_edge_local;
  
  *edge = -1;
  if ((node0 < 0) || (ref_edge->adj->nnode <= node0)) {
    local_3c = -1;
  }
  else {
    local_3c = ref_edge->adj->first[node0];
  }
  n0 = local_3c;
  if (local_3c == -1) {
    local_40 = -1;
  }
  else {
    local_40 = ref_edge->adj->item[local_3c].ref;
  }
  n1 = local_40;
  while( true ) {
    if (n0 == -1) {
      return 5;
    }
    if (((ref_edge->e2n[n1 << 1] == node0) && (ref_edge->e2n[n1 * 2 + 1] == node1)) ||
       ((ref_edge->e2n[n1 << 1] == node1 && (ref_edge->e2n[n1 * 2 + 1] == node0)))) break;
    n0 = ref_edge->adj->item[n0].next;
    if (n0 == -1) {
      local_44 = -1;
    }
    else {
      local_44 = ref_edge->adj->item[n0].ref;
    }
    n1 = local_44;
  }
  *edge = n1;
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_edge_with(REF_EDGE ref_edge, REF_INT node0,
                                 REF_INT node1, REF_INT *edge) {
  REF_INT item, ref;
  REF_INT n0, n1;

  *edge = REF_EMPTY;

  each_ref_adj_node_item_with_ref(ref_edge_adj(ref_edge), node0, item, ref) {
    n0 = ref_edge_e2n(ref_edge, 0, ref);
    n1 = ref_edge_e2n(ref_edge, 1, ref);
    if ((n0 == node0 && n1 == node1) || (n0 == node1 && n1 == node0)) {
      *edge = ref;
      return REF_SUCCESS;
    }
  }

  return REF_NOT_FOUND;
}